

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_functions_to_test.hpp
# Opt level: O1

void duckdb::udf_several_constant_input<int,5>
               (DataChunk *input,ExpressionState *state,Vector *result)

{
  long lVar1;
  long lVar2;
  long lVar3;
  reference pvVar4;
  long lVar5;
  
  duckdb::Vector::SetVectorType((VectorType)result);
  lVar1 = *(long *)(result + 0x20);
  pvVar4 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)input,4);
  lVar2 = *(long *)(input + 0x18);
  if (lVar2 != 0) {
    lVar3 = *(long *)(pvVar4 + 0x20);
    lVar5 = 0;
    do {
      *(undefined4 *)(lVar1 + lVar5 * 4) = *(undefined4 *)(lVar3 + lVar5 * 4);
      lVar5 = lVar5 + 1;
    } while (lVar2 != lVar5);
  }
  return;
}

Assistant:

static void udf_several_constant_input(DataChunk &input, ExpressionState &state, Vector &result) {
	result.SetVectorType(VectorType::CONSTANT_VECTOR);
	auto result_data = ConstantVector::GetData<TYPE>(result);
	auto ldata = ConstantVector::GetData<TYPE>(input.data[NUM_INPUT - 1]);

	for (idx_t i = 0; i < input.size(); i++) {
		result_data[i] = ldata[i];
	}
}